

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O0

void bench_field_is_square_var(void *arg,int iters)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  secp256k1_fe t;
  bench_inv *data;
  int j;
  int i;
  secp256k1_fe sStack_48;
  long local_20;
  int local_14;
  int local_10;
  int local_c;
  
  local_14 = 0;
  local_20 = in_RDI;
  local_c = in_ESI;
  memcpy(&sStack_48,(void *)(in_RDI + 0x40),0x28);
  for (local_10 = 0; local_10 < local_c; local_10 = local_10 + 1) {
    iVar1 = secp256k1_fe_impl_is_square_var((secp256k1_fe *)CONCAT44(iters,i));
    local_14 = iVar1 + local_14;
    secp256k1_fe_impl_add(&sStack_48,(secp256k1_fe *)(local_20 + 0x68));
    secp256k1_fe_impl_normalize_var(&sStack_48);
  }
  if (local_c < local_14) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/bench_internal.c"
            ,0xf1,"test condition failed: j <= iters");
    abort();
  }
  return;
}

Assistant:

static void bench_field_is_square_var(void* arg, int iters) {
    int i, j = 0;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_fe t = data->fe[0];

    for (i = 0; i < iters; i++) {
        j += secp256k1_fe_is_square_var(&t);
        secp256k1_fe_add(&t, &data->fe[1]);
        secp256k1_fe_normalize_var(&t);
    }
    CHECK(j <= iters);
}